

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

void ldifusreg(void)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *pIVar4;
  Item *pIVar5;
  char *pcVar6;
  Symbol *pSVar7;
  int n;
  Symbol *d;
  Symbol *s;
  char *dfdcur;
  char *cfindex;
  Item *q1;
  Item *qb2;
  Item *qvexp;
  Item *qb1;
  Item *qdexp;
  Item *q;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar8;
  Symbol *in_stack_ffffffffffffffb0;
  Item *local_30;
  Item *local_8;
  
  uVar8 = 0;
  local_8 = ldifuslist->next;
  while (local_8 != ldifuslist) {
    pIVar1 = (local_8->next->element).itm;
    pIVar2 = local_8->next->next;
    pIVar3 = (pIVar2->element).itm;
    pIVar2 = pIVar2->next;
    local_30 = (pIVar2->element).itm;
    pIVar2 = pIVar2->next;
    pIVar4 = (pIVar2->element).itm;
    pIVar2 = pIVar2->next;
    pIVar5 = (pIVar2->element).itm;
    pIVar2 = pIVar2->next;
    pcVar6 = (pIVar2->element).str;
    uVar8 = uVar8 + 1;
    sprintf(buf,
            "static void* _difspace%d;\nextern double nrn_nernst_coef();\nstatic double _difcoef%d(int _i, double* _p, Datum* _ppvar, double* _pdvol, double* _pdfcdc, ThreadDatum* _thread, NrnThread* _nt) {\n   *_pdvol = "
            ,(ulong)uVar8,(ulong)uVar8);
    lappendstr((List *)in_stack_ffffffffffffffb0,(char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    for (; local_30 != pIVar4; local_30 = local_30->next) {
      lappenditem((List *)in_stack_ffffffffffffffb0,
                  (Item *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    }
    if (*pcVar6 == '\0') {
      sprintf(buf,"; *_pdfcdc=0.;\n");
    }
    else {
      sprintf(buf,";\n if (_i == %s) {\n  *_pdfcdc = %s;\n }else{ *_pdfcdc=0.;}\n",pIVar5,pcVar6);
    }
    lappendstr((List *)in_stack_ffffffffffffffb0,(char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    lappendstr((List *)in_stack_ffffffffffffffb0,(char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    for (local_30 = pIVar1; local_30 != pIVar3; local_30 = local_30->next) {
      lappenditem((List *)in_stack_ffffffffffffffb0,
                  (Item *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    }
    lappendstr((List *)in_stack_ffffffffffffffb0,(char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    local_8 = pIVar2->next;
  }
  lappendstr((List *)in_stack_ffffffffffffffb0,(char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
  uVar8 = 0;
  local_8 = ldifuslist->next;
  while( true ) {
    if (local_8 == ldifuslist) {
      lappendstr((List *)in_stack_ffffffffffffffb0,(char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8)
                );
      return;
    }
    pSVar7 = (local_8->element).sym;
    pIVar1 = local_8->next->next->next->next->next->next;
    uVar8 = uVar8 + 1;
    if ((pSVar7->subtype & 0x20U) == 0) {
      sprintf(buf," (*_f)(_mechtype, _difcoef%d, &_difspace%d, 0, ",(ulong)uVar8,(ulong)uVar8);
    }
    else {
      sprintf(buf," for (_i=0; _i < %d; ++_i) (*_f)(_mechtype, _difcoef%d, &_difspace%d, _i, ",
              (ulong)(uint)pSVar7->araydim,(ulong)uVar8,(ulong)uVar8);
    }
    lappendstr((List *)in_stack_ffffffffffffffb0,(char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    sprintf(buf,"D%s",pSVar7->name);
    in_stack_ffffffffffffffb0 = lookup((char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    if (in_stack_ffffffffffffffb0 == (Symbol *)0x0) break;
    if ((pSVar7->nrntype & 0x1000U) == 0) {
      sprintf(buf,"%d, %d",(ulong)(uint)pSVar7->varnum,
              (ulong)(uint)in_stack_ffffffffffffffb0->varnum);
    }
    else {
      sprintf(buf,"%d, %d",(ulong)(uint)-(pSVar7->ioncount_ + 1),
              (ulong)(uint)in_stack_ffffffffffffffb0->varnum);
    }
    lappendstr((List *)in_stack_ffffffffffffffb0,(char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    lappendstr((List *)in_stack_ffffffffffffffb0,(char *)CONCAT44(uVar8,in_stack_ffffffffffffffa8));
    local_8 = pIVar1->next;
  }
  __assert_fail("d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                ,0x6cd,"void ldifusreg()");
}

Assistant:

void ldifusreg() {
	Item* q, *qdexp, *qb1, *qvexp, *qb2, *q1;
	char* cfindex, *dfdcur;
	Symbol* s, *d;
	int n;
	
	/* ldifuslist format: series of symbol qdexp qb1 svexp qb2
			indexforflux dflux/dconc */
	n = 0;
	ITERATE(q, ldifuslist) {
		s = SYM(q); q = q->next;
		qdexp = ITM(q); q = q->next;
		qb1 = ITM(q); q = q->next;
		qvexp = ITM(q); q = q->next;
		qb2 = ITM(q); q = q->next;
		cfindex = STR(q); q = q->next;
		dfdcur = STR(q);
		++n;
sprintf(buf, "static void* _difspace%d;\nextern double nrn_nernst_coef();\n\
static double _difcoef%d(int _i, double* _p, Datum* _ppvar, double* _pdvol, double* _pdfcdc, ThreadDatum* _thread, NrnThread* _nt) {\n  \
 *_pdvol = ", n, n);
		lappendstr(procfunc, buf);
		for (q1 = qvexp; q1 != qb2; q1 = q1->next) {
			lappenditem(procfunc, q1);
		}
		if (dfdcur[0]) {
			sprintf(buf, ";\n\
 if (_i == %s) {\n  *_pdfcdc = %s;\n }else{ *_pdfcdc=0.;}\n", cfindex, dfdcur);
 		}else{
 			sprintf(buf, "; *_pdfcdc=0.;\n");
 		}
		lappendstr(procfunc, buf);
		lappendstr(procfunc, "  return");
		for (q1 = qdexp; q1 != qb1; q1 = q1->next) {
			lappenditem(procfunc, q1);
		}
		lappendstr(procfunc, ";\n}\n");
	}
#if MAC
	lappendstr(procfunc, "static void _difusfunc(_f, _nt) void *_f; NrnThread* _nt; {int _i;\n");
#else
	lappendstr(procfunc, "static void _difusfunc(_f, _nt) void(*_f)(); NrnThread* _nt; {int _i;\n");
#endif
	n = 0;
	ITERATE(q, ldifuslist) {
		s = SYM(q); q = q->next;
		qdexp = ITM(q); q = q->next;
		qb1 = ITM(q); q = q->next;
		qvexp = ITM(q); q = q->next;
		qb2 = ITM(q); q = q->next;
		cfindex = STR(q); q = q->next;
		dfdcur = STR(q);
		++n;

		if (s->subtype & ARRAY) {
#if MAC
sprintf(buf, " for (_i=0; _i < %d; ++_i) mac_difusfunc(_f, _mechtype, _difcoef%d, &_difspace%d, _i, ", s->araydim, n, n);
#else
sprintf(buf, " for (_i=0; _i < %d; ++_i) (*_f)(_mechtype, _difcoef%d, &_difspace%d, _i, ", s->araydim, n, n);
#endif
		}else{
#if MAC
sprintf(buf, " mac_difusfunc(_f,_mechtype, _difcoef%d, &_difspace%d, 0, ", n, n);
#else
sprintf(buf, " (*_f)(_mechtype, _difcoef%d, &_difspace%d, 0, ", n, n);
#endif
		}
		lappendstr(procfunc, buf);

		sprintf(buf, "D%s", s->name);
		d = lookup(buf);
		assert(d);
		if (s->nrntype & IONCONC) {
			sprintf(buf, "%d, %d",
			  - (s->ioncount_ + 1), d->varnum);
		}else{
			sprintf(buf, "%d, %d", s->varnum, d->varnum);
		}
		lappendstr(procfunc, buf);
		lappendstr(procfunc, ", _nt);\n");
	}
	lappendstr(procfunc, "}\n");
}